

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEvS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  uchar uVar5;
  byte bVar6;
  int8_t iVar7;
  bool bVar8;
  uint16_t uVar9;
  unsigned_short uVar10;
  uint uVar11;
  char *pcVar12;
  FieldAux *pFVar13;
  int *piVar14;
  uint *puVar15;
  ulong uVar16;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint32_t *extraout_RDX;
  uint32_t *extraout_RDX_00;
  uint32_t *extraout_RDX_01;
  uint32_t *extraout_RDX_02;
  uint32_t *extraout_RDX_03;
  uint32_t *extraout_RDX_04;
  uint32_t *extraout_RDX_05;
  uint32_t *extraout_RDX_06;
  uint32_t *extraout_RDX_07;
  uint32_t *extraout_RDX_08;
  uint32_t *extraout_RDX_09;
  uint32_t *extraout_RDX_10;
  uint32_t *data_00;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_348;
  ulong local_340;
  uint64_t tmp;
  char *ptr2;
  FieldAux local_328;
  FieldAux aux;
  uint64_t local_318;
  TcParseTableBase *local_310;
  ParseContext *local_308;
  char *local_300;
  MessageLite *local_2f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2f0;
  TcFieldData local_2e8;
  TcFieldData local_2e0;
  undefined1 local_2d1;
  ulong uStack_2d0;
  bool always_return;
  TcParseTableBase *local_2c8;
  ParseContext *local_2c0;
  char *local_2b8;
  MessageLite *local_2b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2a8;
  ulong local_2a0;
  int64_t res;
  char *local_290;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_288;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t local_1d8;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  char *local_158;
  char *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  local_318 = hasbits;
  local_310 = table;
  local_308 = ctx;
  local_300 = ptr;
  local_2f8 = msg;
  local_2f0 = data.field_0;
  uVar5 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_2f0);
  pMVar3 = local_2f8;
  pcVar12 = local_300;
  pPVar2 = local_308;
  pTVar1 = local_310;
  if (uVar5 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&aux);
    pcVar12 = MiniParse(pMVar3,pcVar12,pPVar2,(TcFieldData)aux.enum_range,local_310,local_318);
    return pcVar12;
  }
  bVar6 = TcFieldData::aux_idx((TcFieldData *)&local_2f0);
  pFVar13 = TcParseTableBase::field_aux(pTVar1,(uint)bVar6);
  ptr2 = *(char **)pFVar13;
  tmp = (uint64_t)local_300;
  local_300 = local_300 + 1;
  res = (int64_t)&local_340;
  last.p = &local_158;
  res2 = (int64_t)&local_158;
  local_328 = (FieldAux)ptr2;
  local_290 = local_300;
  local_158 = local_300;
  iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
  local_2a0 = (ulong)iVar7;
  if (iVar7 < '\0') {
    local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_148 = &res3;
    res3 = (long)local_131 << 7 | local_2a0 >> 0x39;
    data_00 = extraout_RDX_00;
    local_d9 = local_131;
    if (res3 < 0) {
      local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_130 = &local_188;
      local_188 = (long)local_119 << 0xe | local_2a0 >> 0x32;
      data_00 = extraout_RDX_01;
      local_c9 = local_119;
      if ((long)local_188 < 0) {
        local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_118 = &res3;
        res3 = ((long)local_101 << 0x15 | local_2a0 >> 0x2b) & res3;
        data_00 = extraout_RDX_02;
        local_b9 = local_101;
        if (res3 < 0) {
          local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                               (&last);
          local_100 = &local_188;
          local_188 = ((long)local_e9 << 0x1c | local_2a0 >> 0x24) & local_188;
          data_00 = extraout_RDX_03;
          local_a9 = local_e9;
          if ((long)local_188 < 0) {
            local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_a8 = &res3;
            res3 = ((long)local_91 << 0x23 | local_2a0 >> 0x1d) & res3;
            data_00 = extraout_RDX_04;
            local_39 = local_91;
            if (res3 < 0) {
              local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_90 = &local_188;
              local_188 = ((long)local_79 << 0x2a | local_2a0 >> 0x16) & local_188;
              data_00 = extraout_RDX_05;
              local_29 = local_79;
              if ((long)local_188 < 0) {
                local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_78 = &res3;
                res3 = ((long)local_61 << 0x31 | local_2a0 >> 0xf) & res3;
                data_00 = extraout_RDX_06;
                local_19 = local_61;
                if (res3 < 0) {
                  local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_60 = &local_188;
                  local_188 = ((long)local_49 << 0x38 | local_2a0 >> 8) & local_188;
                  data_00 = extraout_RDX_07;
                  local_9 = local_49;
                  if (((long)local_188 < 0) &&
                     (iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()(&last), data_00 = extraout_RDX_08, iVar7 != '\x01')) {
                    iVar7 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    if (((int)iVar7 & 0x80U) != 0) {
                      local_150 = (char *)0x0;
                      data_00 = extraout_RDX_09;
                      goto LAB_007a52f8;
                    }
                    bVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()((anon_class_8_1_54a39810 *)&res2);
                    data_00 = extraout_RDX_10;
                    if ((bVar6 & 1) == 0) {
                      local_188 = local_188 ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
      res3 = local_188 & res3;
    }
    local_2a0 = res3 & local_2a0;
    if (local_158 == (char *)0x0) {
      protobuf_assumption_failed
                ("p != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                 ,0x91);
    }
    local_150 = local_158;
  }
  else {
    local_150 = local_158;
    data_00 = extraout_RDX;
  }
LAB_007a52f8:
  local_290 = local_150;
  *(ulong *)res = local_2a0;
  pMVar3 = local_2f8;
  pPVar2 = local_308;
  local_300 = local_290;
  if (local_290 == (char *)0x0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_348);
    pcVar12 = Error(pMVar3,(char *)0x0,pPVar2,(TcFieldData)local_348,local_310,local_318);
    return pcVar12;
  }
  local_1d8 = local_328.offset;
  bVar8 = ValidateEnum((internal *)(local_340 & 0xffffffff),local_1d8,data_00);
  if (((bVar8 ^ 0xffU) & 1) != 0) {
    local_300 = (char *)tmp;
    pcVar12 = FastUnknownEnumFallback
                        (local_2f8,(char *)tmp,local_308,(TcFieldData)local_2f0,local_310,local_318)
    ;
    return pcVar12;
  }
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)&local_2f0);
  pMVar3 = local_2f8;
  local_318 = 1L << (bVar6 & 0x3f) | local_318;
  uVar9 = TcFieldData::offset((TcFieldData *)&local_2f0);
  piVar14 = RefAt<int>(pMVar3,(ulong)uVar9);
  pMVar3 = local_2f8;
  pcVar12 = local_300;
  pPVar2 = local_308;
  *piVar14 = (int)local_340;
  TcFieldData::TcFieldData(&data_local);
  local_2a8 = data_local.field_0;
  local_2b0 = pMVar3;
  local_2b8 = pcVar12;
  local_2c0 = pPVar2;
  local_2c8 = local_310;
  uStack_2d0 = local_318;
  local_2d1 = 0;
  bVar8 = EpsCopyInputStream::DataAvailable(&pPVar2->super_EpsCopyInputStream,pcVar12);
  pMVar3 = local_2b0;
  pcVar12 = local_2b8;
  pPVar2 = local_2c0;
  if (!bVar8) {
    TcFieldData::TcFieldData(&local_2e0);
    if (local_2c8->has_bits_offset != 0) {
      uVar11 = (uint)uStack_2d0;
      puVar15 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_2c8->has_bits_offset);
      *puVar15 = uVar11 | *puVar15;
    }
    return pcVar12;
  }
  TcFieldData::TcFieldData(&local_2e8);
  pTVar1 = local_2c8;
  uVar4 = uStack_2d0;
  uVar10 = UnalignedLoad<unsigned_short>(pcVar12);
  uVar16 = (ulong)(int)((uint)uVar10 & (uint)pTVar1->fast_idx_mask);
  if ((uVar16 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar1,uVar16 >> 3);
  local_280.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar10;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_288.data = local_280.data;
  pcVar12 = (*UNRECOVERED_JUMPTABLE)(pMVar3,pcVar12,pPVar2,(TcFieldData)local_280,pTVar1,uVar4);
  return pcVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnum<uint8_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}